

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gus_pat.cpp
# Opt level: O0

int convert_16ur(uchar *data,_sample *gus_sample)

{
  uint uVar1;
  short *psVar2;
  int *piVar3;
  byte *pbVar4;
  unsigned_long tmp_loop;
  short *write_data;
  uchar *read_end;
  uchar *read_data;
  _sample *gus_sample_local;
  uchar *data_local;
  
  uVar1 = gus_sample->data_length;
  psVar2 = (short *)calloc((ulong)((gus_sample->data_length >> 1) + 2),2);
  gus_sample->data = psVar2;
  if (gus_sample->data == (short *)0x0) {
    piVar3 = __errno_location();
    _WM_ERROR("convert_16ur",0x284,1,"to parse sample",*piVar3);
    data_local._4_4_ = -1;
  }
  else {
    tmp_loop = (unsigned_long)(gus_sample->data + (gus_sample->data_length >> 1));
    read_end = data;
    do {
      tmp_loop = tmp_loop + -2;
      pbVar4 = read_end + 1;
      *(ushort *)tmp_loop = (ushort)*read_end;
      read_end = read_end + 2;
      *(ushort *)tmp_loop = *(ushort *)tmp_loop | (*pbVar4 ^ 0x80) << 8;
    } while (read_end < data + uVar1);
    uVar1 = gus_sample->loop_end;
    gus_sample->loop_end = gus_sample->data_length - gus_sample->loop_start;
    gus_sample->loop_start = gus_sample->data_length - uVar1;
    gus_sample->loop_fraction =
         gus_sample->loop_fraction << 4 | (byte)((int)(gus_sample->loop_fraction & 0xf0) >> 4);
    gus_sample->loop_start = gus_sample->loop_start >> 1;
    gus_sample->loop_end = gus_sample->loop_end >> 1;
    gus_sample->data_length = gus_sample->data_length >> 1;
    gus_sample->modes = gus_sample->modes ^ 0x12;
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int convert_16ur(unsigned char *data, struct _sample *gus_sample) {
	unsigned char *read_data = data;
	unsigned char *read_end = data + gus_sample->data_length;
	signed short int *write_data = NULL;
	unsigned long int tmp_loop = 0;

	SAMPLE_CONVERT_DEBUG(__FUNCTION__);
	gus_sample->data = (short*)calloc(((gus_sample->data_length >> 1) + 2),
			sizeof(signed short int));
	if (gus_sample->data != NULL) {
		write_data = gus_sample->data + (gus_sample->data_length >> 1) - 1;
		do {
			*write_data = *read_data++;
			*write_data-- |= ((*read_data++) ^ 0x80) << 8;
		} while (read_data < read_end);
		tmp_loop = gus_sample->loop_end;
		gus_sample->loop_end = gus_sample->data_length - gus_sample->loop_start;
		gus_sample->loop_start = gus_sample->data_length - tmp_loop;
		gus_sample->loop_fraction = ((gus_sample->loop_fraction & 0x0f) << 4)
				| ((gus_sample->loop_fraction & 0xf0) >> 4);
		gus_sample->loop_start >>= 1;
		gus_sample->loop_end >>= 1;
		gus_sample->data_length >>= 1;
		gus_sample->modes ^= SAMPLE_REVERSE | SAMPLE_UNSIGNED;
		return 0;
	}
	_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_MEM, "to parse sample", errno);
	return -1;
}